

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::framebuffer_texture2d(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  RenderContext *pRVar3;
  allocator<char> local_1a9;
  string local_1a8;
  GLuint local_188;
  deUint32 local_184;
  GLuint texBuf;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  int local_2c;
  GLint local_28;
  int maxSize;
  GLint maxTexCubeSize;
  GLint maxTexSize;
  GLuint tex2DMS;
  GLuint texCube;
  GLuint tex2D;
  GLuint fbo;
  NegativeTestContext *ctx_local;
  
  texCube = 0x1234;
  tex2DMS = 0x1234;
  maxTexSize = 0x1234;
  maxTexCubeSize = 0x1234;
  maxSize = 0x1234;
  local_28 = 0x1234;
  local_2c = 0x1234;
  _tex2D = ctx;
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&texCube);
  glu::CallLogWrapper::glBindFramebuffer(&_tex2D->super_CallLogWrapper,0x8d40,texCube);
  glu::CallLogWrapper::glGenTextures(&_tex2D->super_CallLogWrapper,1,&tex2DMS);
  glu::CallLogWrapper::glBindTexture(&_tex2D->super_CallLogWrapper,0xde1,tex2DMS);
  glu::CallLogWrapper::glGenTextures(&_tex2D->super_CallLogWrapper,1,(GLuint *)&maxTexSize);
  glu::CallLogWrapper::glBindTexture(&_tex2D->super_CallLogWrapper,0x8513,maxTexSize);
  glu::CallLogWrapper::glGenTextures(&_tex2D->super_CallLogWrapper,1,(GLuint *)&maxTexCubeSize);
  glu::CallLogWrapper::glBindTexture(&_tex2D->super_CallLogWrapper,0x9100,maxTexCubeSize);
  glu::CallLogWrapper::glGetIntegerv(&_tex2D->super_CallLogWrapper,0xd33,&maxSize);
  glu::CallLogWrapper::glGetIntegerv(&_tex2D->super_CallLogWrapper,0x851c,&local_28);
  NegativeTestContext::expectError(_tex2D,0);
  pNVar1 = _tex2D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.",&local_51);
  NegativeTestContext::beginSection(pNVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0xffffffff,0x8ce0,0xde1,0,0);
  NegativeTestContext::expectError(_tex2D,0x500);
  NegativeTestContext::endSection(_tex2D);
  pNVar1 = _tex2D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "GL_INVALID_ENUM is generated if textarget is not an accepted texture target.",
             &local_89);
  NegativeTestContext::beginSection(pNVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0xffffffff,tex2DMS,0);
  NegativeTestContext::expectError(_tex2D,0x500);
  NegativeTestContext::endSection(_tex2D);
  pNVar1 = _tex2D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "GL_INVALID_ENUM is generated if attachment is not an accepted token.",&local_b1);
  NegativeTestContext::beginSection(pNVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0xffffffff,0xde1,tex2DMS,0);
  NegativeTestContext::expectError(_tex2D,0x500);
  NegativeTestContext::endSection(_tex2D);
  pNVar1 = _tex2D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "GL_INVALID_VALUE is generated if level is less than 0 or larger than log_2 of maximum texture size."
             ,&local_d9);
  NegativeTestContext::beginSection(pNVar1,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,tex2DMS,-1);
  NegativeTestContext::expectError(_tex2D,0x501);
  local_2c = deLog2Floor32(maxSize);
  local_2c = local_2c + 1;
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,tex2DMS,local_2c);
  NegativeTestContext::expectError(_tex2D,0x501);
  local_2c = deLog2Floor32(maxSize);
  local_2c = local_2c + 1;
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0x8515,maxTexSize,local_2c);
  NegativeTestContext::expectError(_tex2D,0x501);
  NegativeTestContext::endSection(_tex2D);
  pNVar1 = _tex2D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,
             "GL_INVALID_VALUE is generated if level is larger than maximum texture size.",
             &local_101);
  NegativeTestContext::beginSection(pNVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,tex2DMS,maxSize + 1);
  NegativeTestContext::expectError(_tex2D,0x501);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,tex2DMS,-1);
  NegativeTestContext::expectError(_tex2D,0x501);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0x8519,maxTexSize,local_28 + 1);
  NegativeTestContext::expectError(_tex2D,0x501);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0x8519,maxTexSize,-1);
  NegativeTestContext::expectError(_tex2D,0x501);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0x9100,maxTexCubeSize,1);
  NegativeTestContext::expectError(_tex2D,0x501);
  NegativeTestContext::endSection(_tex2D);
  pNVar1 = _tex2D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,
             "GL_INVALID_OPERATION is generated if texture is neither 0 nor the name of an existing texture object."
             ,&local_129);
  NegativeTestContext::beginSection(pNVar1,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,0xffffffff,0);
  NegativeTestContext::expectError(_tex2D,0x502);
  NegativeTestContext::endSection(_tex2D);
  pNVar1 = _tex2D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,
             "GL_INVALID_OPERATION is generated if textarget and texture are not compatible.",
             &local_151);
  NegativeTestContext::beginSection(pNVar1,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0x8515,tex2DMS,0);
  NegativeTestContext::expectError(_tex2D,0x502);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0x9100,tex2DMS,0);
  NegativeTestContext::expectError(_tex2D,0x502);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,maxTexSize,0);
  NegativeTestContext::expectError(_tex2D,0x502);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,maxTexCubeSize,0);
  NegativeTestContext::expectError(_tex2D,0x502);
  glu::CallLogWrapper::glDeleteTextures(&_tex2D->super_CallLogWrapper,1,&tex2DMS);
  glu::CallLogWrapper::glDeleteTextures(&_tex2D->super_CallLogWrapper,1,(GLuint *)&maxTexSize);
  glu::CallLogWrapper::glDeleteTextures(&_tex2D->super_CallLogWrapper,1,(GLuint *)&maxTexCubeSize);
  NegativeTestContext::endSection(_tex2D);
  pNVar1 = _tex2D;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"GL_INVALID_OPERATION is generated if zero is bound to target.",
             &local_179);
  NegativeTestContext::beginSection(pNVar1,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  glu::CallLogWrapper::glBindFramebuffer(&_tex2D->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glFramebufferTexture2D(&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,0,0)
  ;
  NegativeTestContext::expectError(_tex2D,0x502);
  NegativeTestContext::endSection(_tex2D);
  pRVar3 = NegativeTestContext::getRenderContext(_tex2D);
  texBuf = (*pRVar3->_vptr_RenderContext[2])();
  local_184 = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports((ContextType)texBuf,(ApiType)local_184);
  pNVar1 = _tex2D;
  if (bVar2) {
    local_188 = 0x1234;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,
               "GL_INVALID_OPERATION error is generated if texture is the name of a buffer texture."
               ,&local_1a9);
    NegativeTestContext::beginSection(pNVar1,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    glu::CallLogWrapper::glGenTextures(&_tex2D->super_CallLogWrapper,1,&local_188);
    glu::CallLogWrapper::glBindTexture(&_tex2D->super_CallLogWrapper,0x8c2a,local_188);
    glu::CallLogWrapper::glBindFramebuffer(&_tex2D->super_CallLogWrapper,0x8d40,texCube);
    NegativeTestContext::expectError(_tex2D,0);
    glu::CallLogWrapper::glFramebufferTexture2D
              (&_tex2D->super_CallLogWrapper,0x8d40,0x8ce0,0xde1,local_188,0);
    NegativeTestContext::expectError(_tex2D,0x502);
    NegativeTestContext::endSection(_tex2D);
  }
  glu::CallLogWrapper::glDeleteFramebuffers(&_tex2D->super_CallLogWrapper,1,&texCube);
  return;
}

Assistant:

void framebuffer_texture2d (NegativeTestContext& ctx)
{
	GLuint	fbo				= 0x1234;
	GLuint	tex2D			= 0x1234;
	GLuint	texCube			= 0x1234;
	GLuint	tex2DMS			= 0x1234;
	GLint	maxTexSize		= 0x1234;
	GLint	maxTexCubeSize	= 0x1234;
	int		maxSize			= 0x1234;

	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glGenTextures(1, &tex2D);
	ctx.glBindTexture(GL_TEXTURE_2D, tex2D);
	ctx.glGenTextures(1, &texCube);
	ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texCube);
	ctx.glGenTextures(1, &tex2DMS);
	ctx.glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, tex2DMS);
	ctx.glGetIntegerv(GL_MAX_TEXTURE_SIZE, &maxTexSize);
	ctx.glGetIntegerv(GL_MAX_CUBE_MAP_TEXTURE_SIZE, &maxTexCubeSize);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
	ctx.glFramebufferTexture2D(-1, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if textarget is not an accepted texture target.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, -1, tex2D, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if attachment is not an accepted token.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, -1, GL_TEXTURE_2D, tex2D, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0 or larger than log_2 of maximum texture size.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, -1);
	ctx.expectError(GL_INVALID_VALUE);
	maxSize = deLog2Floor32(maxTexSize) + 1;
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, maxSize);
	ctx.expectError(GL_INVALID_VALUE);
	maxSize = deLog2Floor32(maxTexSize) + 1;
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_X, texCube, maxSize);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is larger than maximum texture size.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, maxTexSize + 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_Z, texCube, maxTexCubeSize + 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_Z, texCube, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, tex2DMS, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if texture is neither 0 nor the name of an existing texture object.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, -1, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if textarget and texture are not compatible.");
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_X, tex2D, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, tex2D, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texCube, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2DMS, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glDeleteTextures(1, &tex2D);
	ctx.glDeleteTextures(1, &texCube);
	ctx.glDeleteTextures(1, &tex2DMS);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if zero is bound to target.");
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		GLuint texBuf = 0x1234;
		ctx.beginSection("GL_INVALID_OPERATION error is generated if texture is the name of a buffer texture.");
		ctx.glGenTextures(1, &texBuf);
		ctx.glBindTexture(GL_TEXTURE_BUFFER, texBuf);
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		ctx.expectError(GL_NO_ERROR);
		ctx.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texBuf, 0);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();
	}

	ctx.glDeleteFramebuffers(1, &fbo);
}